

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O3

void archive_entry_set_birthtime(archive_entry *entry,time_t t,long ns)

{
  uint32_t uVar1;
  long lVar2;
  
  lVar2 = ns % 1000000000;
  *(byte *)&entry->ae_set = (byte)entry->ae_set | 0x20;
  entry->stat_valid = L'\0';
  (entry->ae_stat).aest_birthtime = (lVar2 >> 0x3f) + t + ns / 1000000000;
  uVar1 = (uint32_t)lVar2 + 1000000000;
  if (-1 < lVar2) {
    uVar1 = (uint32_t)lVar2;
  }
  (entry->ae_stat).aest_birthtime_nsec = uVar1;
  return;
}

Assistant:

void
archive_entry_set_birthtime(struct archive_entry *entry, __LA_TIME_T t, long ns)
{
	FIX_NS(t, ns);
	entry->stat_valid = 0;
	entry->ae_set |= AE_SET_BIRTHTIME;
	entry->ae_stat.aest_birthtime = t;
	entry->ae_stat.aest_birthtime_nsec = ns;
}